

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_typed_array_get_byteOffset(JSContext *ctx,JSValue this_val,int is_dataview)

{
  JSObject *pJVar1;
  JSValueUnion JVar2;
  int64_t iVar3;
  JSValue JVar4;
  
  pJVar1 = get_typed_array(ctx,this_val,is_dataview);
  iVar3 = 6;
  if (pJVar1 == (JSObject *)0x0) {
LAB_0015b7ac:
    JVar2.float64 = 0.0;
  }
  else {
    if (((((pJVar1->u).typed_array)->buffer->u).array_buffer)->detached == '\0') {
      JVar2._4_4_ = 0;
      JVar2.int32 = ((pJVar1->u).typed_array)->offset;
    }
    else {
      if (is_dataview != 0) {
        JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
        goto LAB_0015b7ac;
      }
      JVar2.float64 = 0.0;
    }
    iVar3 = 0;
  }
  JVar4.tag = iVar3;
  JVar4.u.float64 = JVar2.float64;
  return JVar4;
}

Assistant:

static JSValue js_typed_array_get_byteOffset(JSContext *ctx,
                                             JSValueConst this_val,
                                             int is_dataview)
{
    JSObject *p;
    JSTypedArray *ta;
    p = get_typed_array(ctx, this_val, is_dataview);
    if (!p)
        return JS_EXCEPTION;
    if (typed_array_is_detached(ctx, p)) {
        if (is_dataview) {
            return JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
        } else {
            return JS_NewInt32(ctx, 0);
        }
    }
    ta = p->u.typed_array;
    return JS_NewInt32(ctx, ta->offset);
}